

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::~cmComputeLinkInformation(cmComputeLinkInformation *this)

{
  cmComputeLinkInformation *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  ::~map(&this->GroupFeatureDescriptors);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  ::~map(&this->LibraryFeatureDescriptors);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            (&this->OrderRuntimeSearchPath);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            (&this->OrderDependentRPath);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->CMP0060WarnItems);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OldUserFlagItems);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OldLinkDirItems);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->OldLinkDirMask);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->RuntimeLinkDirs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->ImplicitLinkLibs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->ImplicitLinkDirs);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            (&this->OrderLinkerSearchPath);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->FrameworkPathsEmitted);
  std::__cxx11::string::~string((string *)&this->SharedRegexString);
  cmsys::RegularExpression::~RegularExpression(&this->ExtractAnyLibraryName);
  cmsys::RegularExpression::~RegularExpression(&this->ExtractSharedLibraryName);
  cmsys::RegularExpression::~RegularExpression(&this->ExtractStaticLibraryName);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->LinkPrefixes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LinkExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SharedLinkExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->StaticLinkExtensions);
  std::__cxx11::string::~string((string *)&this->SharedLinkTypeFlag);
  std::__cxx11::string::~string((string *)&this->StaticLinkTypeFlag);
  std::__cxx11::string::~string((string *)&this->RPathLinkFlag);
  std::__cxx11::string::~string((string *)&this->RuntimeAlways);
  std::__cxx11::string::~string((string *)&this->RuntimeSep);
  std::__cxx11::string::~string((string *)&this->RuntimeFlag);
  std::__cxx11::string::~string((string *)&this->LibLinkSuffix);
  std::__cxx11::string::~string((string *)&this->ObjLinkFileFlag);
  std::__cxx11::string::~string((string *)&this->LibLinkFileFlag);
  std::__cxx11::string::~string((string *)&this->LibLinkFlag);
  std::__cxx11::string::~string((string *)&this->LinkLanguage);
  std::__cxx11::string::~string((string *)&this->Config);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
            (&this->RuntimeDLLs);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set(&this->SharedLibrariesLinked);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->RuntimeSearchPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->FrameworkPaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Directories);
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  ~vector(&this->Items);
  return;
}

Assistant:

cmComputeLinkInformation::~cmComputeLinkInformation() = default;